

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O2

void __thiscall
OpenMD::LangevinPiston::getPosScale
          (LangevinPiston *this,Vector3d *pos,Vector3d *COM,int index,Vector3d *sc)

{
  Vector3d rj;
  Vector<double,_3U> VStack_88;
  Vector<double,_3U> local_70;
  Vector<double,_3U> local_58;
  Vector<double,_3U> local_40;
  
  OpenMD::operator+(&local_70,
                    &(this->super_NPT).oldPos.
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[index].super_Vector<double,_3U>,
                    &pos->super_Vector<double,_3U>);
  operator/(&local_58,&local_70,2.0);
  operator-(&VStack_88,&local_58,&COM->super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&local_40,&VStack_88);
  operator*(&VStack_88,this->eta,&local_40);
  Vector3<double>::operator=(sc,&VStack_88);
  return;
}

Assistant:

void LangevinPiston::getPosScale(const Vector3d& pos, const Vector3d& COM,
                                   int index, Vector3d& sc) {
    Vector3d rj = (oldPos[index] + pos) / (RealType)2.0 - COM;
    sc          = eta * rj;
  }